

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecoderGPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  
  DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  if ((DVar1 != MCDisassembler_Fail) && (DVar1 != MCDisassembler_SoftFail)) {
    DVar1 = (uint)((RegNo & 0xfffffffd) != 0xd) * 2 + MCDisassembler_SoftFail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecoderGPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	if (RegNo == 13 || RegNo == 15)
		S = MCDisassembler_SoftFail;
	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));
	return S;
}